

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::IsBlockRequestedFromOutbound
          (PeerManagerImpl *this,uint256 *hash)

{
  _Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>
  _Var1;
  _Self __tmp;
  long in_FS_OFFSET;
  bool bVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
  pVar3;
  PeerRef peer;
  CValidationInterface local_40;
  NetEventsInterface local_38;
  uint64_t local_30;
  
  local_30 = *(uint64_t *)(in_FS_OFFSET + 0x28);
  pVar3 = std::
          multimap<uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::pair<long,_std::_List_iterator<(anonymous_namespace)::QueuedBlock>_>_>_>_>
          ::equal_range(&this->mapBlocksInFlight,hash);
  _Var1 = pVar3.first._M_node;
  bVar2 = _Var1._M_node != pVar3.second._M_node._M_node;
  if (bVar2) {
    do {
      GetPeerRef((PeerManagerImpl *)&stack0xffffffffffffffc0,(NodeId)this);
      if ((local_40._vptr_CValidationInterface != (_func_int **)0x0) &&
         (*(char *)(local_40._vptr_CValidationInterface + 3) != '\x01')) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_NetEventsInterface !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_38._vptr_NetEventsInterface);
        }
        break;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_NetEventsInterface !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._vptr_NetEventsInterface
                  );
      }
      _Var1._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var1._M_node);
      bVar2 = _Var1._M_node != pVar3.second._M_node._M_node;
    } while (bVar2);
  }
  if (*(uint64_t *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool PeerManagerImpl::IsBlockRequestedFromOutbound(const uint256& hash)
{
    for (auto range = mapBlocksInFlight.equal_range(hash); range.first != range.second; range.first++) {
        auto [nodeid, block_it] = range.first->second;
        PeerRef peer{GetPeerRef(nodeid)};
        if (peer && !peer->m_is_inbound) return true;
    }

    return false;
}